

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeFunction<false,true,false,false>
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  byte bVar3;
  JavascriptFunction *obj;
  ScriptFunction *this;
  FunctionProxy *this_00;
  ParseableFunctionInfo *pPVar5;
  JavascriptString *local_38;
  JavascriptString *functionName;
  int iVar4;
  
  obj = VarTo<Js::JavascriptFunction,Js::DynamicObject>(instance);
  pJVar1 = (((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
  bVar2 = VarIs<Js::ScriptFunction,Js::JavascriptFunction>(obj);
  if (bVar2) {
    this = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    iVar4 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x77])(this);
    bVar3 = (byte)iVar4;
  }
  else {
    this = (ScriptFunction *)0x0;
    bVar3 = 0;
  }
  DeferredTypeHandlerBase::ConvertFunction
            (typeHandler,obj,(&pJVar1->anonymousFunctionTypeHandler)[(ulong)(bVar3 ^ 1) * 2].ptr);
  if (this != (ScriptFunction *)0x0) {
    this_00 = ScriptFunction::GetFunctionProxy(this);
    pPVar5 = FunctionProxy::EnsureDeserialized(this_00);
    if (bVar3 != 0) {
      return true;
    }
    if (((pPVar5->super_FunctionProxy).field_0x45 & 0x10) != 0) {
      return true;
    }
  }
  local_38 = (JavascriptString *)0x0;
  bVar2 = JavascriptFunction::GetFunctionName(obj,&local_38);
  if (bVar2) {
    (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])(obj,0x106,local_38,2,0,0,0xf)
    ;
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptFunction * function = VarTo<JavascriptFunction>(instance);
        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        ScriptFunction *scriptFunction = nullptr;
        bool useAnonymous = false;
        if (VarIs<ScriptFunction>(function))
        {
            scriptFunction = Js::VarTo<Js::ScriptFunction>(function);
            useAnonymous = scriptFunction->IsAnonymousFunction();
        }

        if (!addPrototype)
        {
            if (!useAnonymous && addName)
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionTypeHandlerWithLength : javascriptLibrary->functionTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionTypeHandler);
            }
        }
        else
        {
            if (useAnonymous)
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionWithPrototypeAndLengthTypeHandler : javascriptLibrary->functionWithPrototypeTypeHandler);
            }
            DynamicObject *protoObject = javascriptLibrary->CreateConstructorPrototypeObject(function);
            if (scriptFunction && scriptFunction->GetFunctionInfo()->IsClassConstructor())
            {
                function->SetPropertyWithAttributes(PropertyIds::prototype, protoObject, PropertyNone, nullptr);
            }
            else
            {
                function->SetProperty(PropertyIds::prototype, protoObject, PropertyOperation_None, nullptr);
            }
        }

        if (scriptFunction)
        {
            ParseableFunctionInfo * funcInfo = scriptFunction->GetFunctionProxy()->EnsureDeserialized();

            CompileAssert(!addLength || useLengthType);
            if (addLength)
            {
                function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(funcInfo->GetReportedInParamsCount() - 1), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
            }

            if (useAnonymous || funcInfo->GetIsStaticNameFunction())
            {
                return true;
            }
        }

        if (addName)
        {
            JavascriptString * functionName = nullptr;
            if (((Js::JavascriptFunction*)function)->GetFunctionName(&functionName))
            {
                function->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
        }

        return true;
    }